

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O2

char * received_time_to_db_string(char *string_buf,size_t string_buf_len)

{
  time_t rawtime;
  tm ptm;
  time_t local_60;
  tm local_58;
  
  local_58.tm_isdst = 0;
  local_58._36_4_ = 0;
  local_58.tm_gmtoff = 0;
  local_58.tm_mon = 0;
  local_58.tm_year = 0;
  local_58.tm_wday = 0;
  local_58.tm_yday = 0;
  local_58.tm_sec = 0;
  local_58.tm_min = 0;
  local_58.tm_hour = 0;
  local_58.tm_mday = 0;
  local_58.tm_zone = (char *)0x0;
  time(&local_60);
  localtime_r(&local_60,&local_58);
  strftime(string_buf,string_buf_len,"%Y%m%d,%H%M%S",&local_58);
  return string_buf;
}

Assistant:

char* received_time_to_db_string(char *string_buf, size_t string_buf_len) {
    time_t rawtime;
    struct tm ptm = { 0 };

    time(&rawtime);
    localtime_r(&rawtime, &ptm);
    strftime(string_buf, string_buf_len, "%Y%m%d,%H%M%S", &ptm);
    return string_buf;
}